

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

TRef crec_tv_ct(jit_State *J,CType *s,CTypeID sid,TRef sp)

{
  uint uVar1;
  CTState *cts;
  ushort uVar2;
  IRRef1 IVar3;
  IRType IVar4;
  uint uVar5;
  TRef TVar6;
  TRef TVar7;
  TRef TVar8;
  TRef TVar9;
  ulong u64;
  int iVar10;
  CTypeID local_34;
  
  IVar3 = (IRRef1)sp;
  cts = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  IVar4 = crec_ct2irt(cts,s);
  uVar1 = s->info;
  uVar2 = (ushort)IVar4;
  local_34 = sid;
  if (0xfffffff < uVar1) {
    uVar5 = uVar1 >> 0x1c;
    if ((uVar5 == 5) || (uVar5 == 2)) {
      (J->fold).ins.field_0.ot = uVar2 | 0x4600;
      (J->fold).ins.field_0.op1 = IVar3;
      (J->fold).ins.field_0.op2 = 0;
      TVar6 = lj_opt_fold(J);
      IVar3 = (IRRef1)TVar6;
      goto LAB_0015a334;
    }
    if ((uVar1 & 0xfc000000) == 0x30000000 || uVar5 == 1) {
      cts->L = J->L;
      local_34 = lj_ctype_intern(cts,sid + 0x22830000,8);
      goto LAB_0015a334;
    }
    if ((uVar1 & 0xf4000000) == 0x34000000) {
      u64 = (ulong)(s->size >> 1);
      TVar6 = lj_ir_kint(J,sid);
      (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x538a7fff;
      TVar6 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = uVar2 | 0x4600;
      (J->fold).ins.field_0.op1 = IVar3;
      (J->fold).ins.field_0.op2 = 0;
      TVar7 = lj_opt_fold(J);
      TVar8 = lj_ir_kint64(J,u64);
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = IVar3;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
      TVar8 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = uVar2 | 0x4600;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
      (J->fold).ins.field_0.op2 = 0;
      TVar8 = lj_opt_fold(J);
      TVar9 = lj_ir_kint64(J,0x10);
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
      TVar9 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = uVar2 | 0x4e00;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
      lj_opt_fold(J);
      TVar7 = lj_ir_kint64(J,u64 + 0x10);
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
      TVar7 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = uVar2 | 0x4e00;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
      lj_opt_fold(J);
      return TVar6;
    }
    goto LAB_0015a548;
  }
  if (IVar4 == IRT_CDATA) {
    iVar10 = 2;
LAB_0015a22c:
    IVar3 = (IRRef1)sp;
    sp = (TRef)s;
  }
  else {
    (J->fold).ins.field_0.ot = uVar2 | 0x4600;
    (J->fold).ins.field_0.op1 = IVar3;
    (J->fold).ins.field_0.op2 = 0;
    sp = lj_opt_fold(J);
    s = (CType *)(ulong)sp;
    if ((IVar4 == IRT_U32) || (IVar4 == IRT_FLOAT)) {
      (J->fold).ins.field_0.ot = 0x5b0e;
      (J->fold).ins.field_0.op1 = (IRRef1)sp;
      (J->fold).ins.field_0.op2 = uVar2 | 0x1c0;
      sp = lj_opt_fold(J);
      iVar10 = 1;
    }
    else {
      if (IVar4 - IRT_I64 < 2) {
        iVar10 = 0;
        goto LAB_0015a22c;
      }
      iVar10 = 1;
      if (0x7ffffff < uVar1) {
        TVar6 = lj_ir_kint(J,0);
        (J->fold).ins.field_0.ot = 0x993;
        (J->fold).ins.field_0.op1 = (IRRef1)sp;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
        J->postproc = LJ_POST_FIXGUARD;
        sp = 0x2007ffd;
      }
    }
  }
  if (iVar10 == 0) {
LAB_0015a334:
    TVar6 = lj_ir_kint(J,local_34);
    (J->fold).ins.field_0.ot = 0x548a;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = IVar3;
    TVar6 = lj_opt_fold(J);
    return TVar6;
  }
  if (iVar10 != 2) {
    return sp;
  }
LAB_0015a548:
  lj_trace_err(J,LJ_TRERR_NYICONV);
}

Assistant:

static TRef crec_tv_ct(jit_State *J, CType *s, CTypeID sid, TRef sp)
{
  CTState *cts = ctype_ctsG(J2G(J));
  IRType t = crec_ct2irt(cts, s);
  CTInfo sinfo = s->info;
  if (ctype_isnum(sinfo)) {
    TRef tr;
    if (t == IRT_CDATA)
      goto err_nyi;  /* NYI: copyval of >64 bit integers. */
    tr = emitir(IRT(IR_XLOAD, t), sp, 0);
    if (t == IRT_FLOAT || t == IRT_U32) {  /* Keep uint32_t/float as numbers. */
      return emitconv(tr, IRT_NUM, t, 0);
    } else if (t == IRT_I64 || t == IRT_U64) {  /* Box 64 bit integer. */
      sp = tr;
      lj_needsplit(J);
    } else if ((sinfo & CTF_BOOL)) {
      /* Assume not equal to zero. Fixup and emit pending guard later. */
      lj_ir_set(J, IRTGI(IR_NE), tr, lj_ir_kint(J, 0));
      J->postproc = LJ_POST_FIXGUARD;
      return TREF_TRUE;
    } else {
      return tr;
    }
  } else if (ctype_isptr(sinfo) || ctype_isenum(sinfo)) {
    sp = emitir(IRT(IR_XLOAD, t), sp, 0);  /* Box pointers and enums. */
  } else if (ctype_isrefarray(sinfo) || ctype_isstruct(sinfo)) {
    cts->L = J->L;
    sid = lj_ctype_intern(cts, CTINFO_REF(sid), CTSIZE_PTR);  /* Create ref. */
  } else if (ctype_iscomplex(sinfo)) {  /* Unbox/box complex. */
    ptrdiff_t esz = (ptrdiff_t)(s->size >> 1);
    TRef ptr, tr1, tr2, dp;
    dp = emitir(IRTG(IR_CNEW, IRT_CDATA), lj_ir_kint(J, sid), TREF_NIL);
    tr1 = emitir(IRT(IR_XLOAD, t), sp, 0);
    ptr = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, esz));
    tr2 = emitir(IRT(IR_XLOAD, t), ptr, 0);
    ptr = emitir(IRT(IR_ADD, IRT_PTR), dp, lj_ir_kintp(J, sizeof(GCcdata)));
    emitir(IRT(IR_XSTORE, t), ptr, tr1);
    ptr = emitir(IRT(IR_ADD, IRT_PTR), dp, lj_ir_kintp(J, sizeof(GCcdata)+esz));
    emitir(IRT(IR_XSTORE, t), ptr, tr2);
    return dp;
  } else {
    /* NYI: copyval of vectors. */
  err_nyi:
    lj_trace_err(J, LJ_TRERR_NYICONV);
  }
  /* Box pointer, ref, enum or 64 bit integer. */
  return emitir(IRTG(IR_CNEWI, IRT_CDATA), lj_ir_kint(J, sid), sp);
}